

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O2

REF_STATUS ref_adapt_surf_to_geom(REF_GRID ref_grid,REF_INT passes)

{
  uint in_EAX;
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uStack_38;
  REF_BOOL all_done;
  
  uStack_38 = (ulong)in_EAX;
  uVar1 = ref_migrate_to_balance(ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_metric_interpolated_curvature(ref_grid);
    if (uVar1 == 0) {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"curvature");
      uVar1 = ref_adapt_tattle_faces(ref_grid);
      if (uVar1 == 0) {
        ref_mpi_stopwatch_stop(ref_grid->mpi,"tattle faces");
        uVar1 = 1;
        iVar2 = 0;
        while( true ) {
          if (iVar2 != 0) {
            return 0;
          }
          if (passes <= (int)(uVar1 - 1)) {
            return 0;
          }
          if (ref_grid->mpi->id == 0) {
            printf("\n pass %d of %d with %d ranks\n",(ulong)uVar1,passes,
                   (ulong)(uint)ref_grid->mpi->n);
          }
          uVar3 = ref_adapt_pass(ref_grid,&all_done);
          if (uVar3 != 0) break;
          uVar3 = ref_migrate_to_balance(ref_grid);
          if (uVar3 != 0) {
            pcVar5 = "migrate to single part";
            uVar4 = 0x339;
            goto LAB_0014d91b;
          }
          uVar3 = ref_grid_pack(ref_grid);
          if (uVar3 != 0) {
            pcVar5 = "pack";
            uVar4 = 0x33a;
            goto LAB_0014d91b;
          }
          ref_mpi_stopwatch_stop(ref_grid->mpi,"pack");
          uVar3 = ref_metric_interpolated_curvature(ref_grid);
          if (uVar3 != 0) {
            pcVar5 = "interp curve";
            uVar4 = 0x33d;
            goto LAB_0014d91b;
          }
          ref_mpi_stopwatch_stop(ref_grid->mpi,"curvature");
          uVar3 = ref_adapt_tattle_faces(ref_grid);
          if (uVar3 != 0) {
            pcVar5 = "tattle";
            uVar4 = 0x340;
            goto LAB_0014d91b;
          }
          ref_mpi_stopwatch_stop(ref_grid->mpi,"tattle faces");
          uVar1 = uVar1 + 1;
          iVar2 = all_done;
        }
        pcVar5 = "pass";
        uVar4 = 0x337;
LAB_0014d91b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               uVar4,"ref_adapt_surf_to_geom",(ulong)uVar3,pcVar5);
        return uVar3;
      }
      pcVar5 = "tattle";
      uVar4 = 0x330;
    }
    else {
      pcVar5 = "interp curve";
      uVar4 = 0x32e;
    }
  }
  else {
    pcVar5 = "migrate to single part";
    uVar4 = 0x32d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar4,
         "ref_adapt_surf_to_geom",(ulong)uVar1,pcVar5);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_surf_to_geom(REF_GRID ref_grid, REF_INT passes) {
  REF_BOOL all_done = REF_FALSE;
  REF_INT pass;

  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_metric_interpolated_curvature(ref_grid), "interp curve");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "curvature");
  RSS(ref_adapt_tattle_faces(ref_grid), "tattle");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "tattle faces");

  for (pass = 0; !all_done && pass < passes; pass++) {
    if (ref_grid_once(ref_grid))
      printf("\n pass %d of %d with %d ranks\n", pass + 1, passes,
             ref_mpi_n(ref_grid_mpi(ref_grid)));
    RSS(ref_adapt_pass(ref_grid, &all_done), "pass");

    RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
    RSS(ref_grid_pack(ref_grid), "pack");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "pack");

    RSS(ref_metric_interpolated_curvature(ref_grid), "interp curve");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "curvature");

    RSS(ref_adapt_tattle_faces(ref_grid), "tattle");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "tattle faces");
  }

  return REF_SUCCESS;
}